

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.c
# Opt level: O3

int32_t intersect_skewed_uint16
                  (uint16_t *small,size_t size_s,uint16_t *large,size_t size_l,uint16_t *buffer)

{
  ushort *puVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  ushort *puVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  ushort *puVar16;
  ulong uVar17;
  int iVar18;
  ushort *puVar19;
  ulong uVar20;
  long lVar21;
  ushort *puVar22;
  ulong uVar23;
  
  if (size_s == 0) {
    lVar21 = 0;
  }
  else {
    bVar6 = size_l != 0;
    iVar9 = (int)size_l;
    if (size_l == 0 || size_s < 4) {
      iVar18 = 0;
      iVar14 = 0;
      uVar8 = 0;
      uVar15 = 0;
      lVar21 = 0;
    }
    else {
      lVar21 = 0;
      uVar15 = 0;
      uVar17 = 0;
      uVar23 = 0;
      uVar12 = 0;
      uVar20 = 0;
      uVar10 = 0;
      uVar7 = 4;
      do {
        uVar8 = uVar7;
        uVar2 = small[uVar10];
        uVar3 = small[uVar10 + 1];
        uVar4 = small[uVar10 + 2];
        uVar5 = small[uVar10 + 3];
        uVar13 = iVar9 - (int)uVar15;
        if (uVar13 != 0) {
          puVar1 = large + uVar15;
          puVar11 = puVar1;
          puVar16 = puVar1;
          puVar19 = puVar1;
          puVar22 = puVar1;
          for (; 1 < (int)uVar13; uVar13 = uVar13 - (uVar13 >> 1)) {
            uVar10 = (ulong)(uVar13 & 0xfffffffe);
            if (*(ushort *)((long)puVar19 + uVar10) < uVar2) {
              puVar19 = (ushort *)((long)puVar19 + uVar10);
            }
            if (*(ushort *)((long)puVar11 + uVar10) < uVar3) {
              puVar11 = (ushort *)((long)puVar11 + uVar10);
            }
            if (*(ushort *)((long)puVar22 + uVar10) < uVar4) {
              puVar22 = (ushort *)((long)puVar22 + uVar10);
            }
            if (*(ushort *)((long)puVar16 + uVar10) < uVar5) {
              puVar16 = (ushort *)((long)puVar16 + uVar10);
            }
          }
          uVar20 = (long)puVar19 + ((ulong)(*puVar19 < uVar2) * 2 - (long)puVar1) >> 1;
          uVar12 = (long)puVar11 + ((ulong)(*puVar11 < uVar3) * 2 - (long)puVar1) >> 1;
          uVar23 = (long)puVar22 + ((ulong)(*puVar22 < uVar4) * 2 - (long)puVar1) >> 1;
          uVar17 = (long)puVar16 + ((ulong)(*puVar16 < uVar5) * 2 - (long)puVar1) >> 1;
        }
        iVar14 = (int)uVar12;
        iVar18 = (int)uVar20;
        if (((long)iVar18 + uVar15 < size_l) && (large[(long)iVar18 + uVar15] == uVar2)) {
          buffer[lVar21] = uVar2;
          lVar21 = lVar21 + 1;
        }
        if (((long)iVar14 + uVar15 < size_l) && (large[(long)iVar14 + uVar15] == uVar3)) {
          buffer[lVar21] = uVar3;
          lVar21 = lVar21 + 1;
        }
        uVar10 = (long)(int)uVar23 + uVar15;
        if ((uVar10 < size_l) && (large[uVar10] == uVar4)) {
          buffer[lVar21] = uVar4;
          lVar21 = lVar21 + 1;
        }
        uVar15 = uVar15 + (long)(int)uVar17;
        if (size_l <= uVar15) goto LAB_0012017f;
        if (large[uVar15] == uVar5) {
          buffer[lVar21] = uVar5;
          lVar21 = lVar21 + 1;
        }
        bVar6 = true;
      } while ((uVar8 + 4 <= size_s) && (uVar10 = uVar8, uVar7 = uVar8 + 4, uVar15 < size_l));
    }
    uVar10 = uVar8 | 2;
    if (!(bool)(bVar6 ^ 1U | size_s < uVar10)) {
      uVar2 = small[uVar8];
      uVar3 = small[uVar8 + 1];
      uVar13 = iVar9 - (int)uVar15;
      if (uVar13 != 0) {
        puVar1 = large + uVar15;
        puVar11 = puVar1;
        puVar16 = puVar1;
        for (; 1 < (int)uVar13; uVar13 = uVar13 - (uVar13 >> 1)) {
          uVar8 = (ulong)(uVar13 & 0xfffffffe);
          if (*(ushort *)((long)puVar16 + uVar8) < uVar2) {
            puVar16 = (ushort *)((long)puVar16 + uVar8);
          }
          if (*(ushort *)((long)puVar11 + uVar8) < uVar3) {
            puVar11 = (ushort *)((long)puVar11 + uVar8);
          }
        }
        iVar18 = (int)((long)puVar16 + ((ulong)(*puVar16 < uVar2) * 2 - (long)puVar1) >> 1);
        iVar14 = (int)((long)puVar11 + ((ulong)(*puVar11 < uVar3) * 2 - (long)puVar1) >> 1);
      }
      if (((long)iVar18 + uVar15 < size_l) && (large[(long)iVar18 + uVar15] == uVar2)) {
        buffer[lVar21] = uVar2;
        lVar21 = lVar21 + 1;
      }
      uVar15 = uVar15 + (long)iVar14;
      uVar8 = uVar10;
      if ((uVar15 < size_l) && (large[uVar15] == uVar3)) {
        buffer[lVar21] = uVar3;
        lVar21 = lVar21 + 1;
      }
    }
LAB_0012017f:
    if (((uVar8 < size_s) && (uVar15 < size_l)) && (iVar9 = iVar9 - (int)uVar15, 0 < iVar9)) {
      uVar2 = small[uVar8];
      iVar9 = iVar9 + -1;
      iVar14 = 0;
      do {
        uVar13 = (uint)(iVar9 + iVar14) >> 1;
        uVar3 = *(ushort *)((long)large + (ulong)(iVar9 + iVar14 & 0xfffffffe) + uVar15 * 2);
        if (uVar3 < uVar2) {
          iVar14 = uVar13 + 1;
        }
        else {
          if (uVar3 <= uVar2) {
            buffer[lVar21] = uVar2;
            lVar21 = lVar21 + 1;
            break;
          }
          iVar9 = uVar13 - 1;
        }
      } while (iVar14 <= iVar9);
    }
  }
  return (int32_t)lVar21;
}

Assistant:

int32_t intersect_skewed_uint16(const uint16_t *small, size_t size_s,
                                const uint16_t *large, size_t size_l,
                                uint16_t *buffer) {
    size_t pos = 0, idx_l = 0, idx_s = 0;

    if (0 == size_s) {
        return 0;
    }
    int32_t index1 = 0, index2 = 0, index3 = 0, index4 = 0;
    while ((idx_s + 4 <= size_s) && (idx_l < size_l)) {
        uint16_t target1 = small[idx_s];
        uint16_t target2 = small[idx_s + 1];
        uint16_t target3 = small[idx_s + 2];
        uint16_t target4 = small[idx_s + 3];
        binarySearch4(large + idx_l, (int32_t)(size_l - idx_l), target1,
                      target2, target3, target4, &index1, &index2, &index3,
                      &index4);
        if ((index1 + idx_l < size_l) && (large[idx_l + index1] == target1)) {
            buffer[pos++] = target1;
        }
        if ((index2 + idx_l < size_l) && (large[idx_l + index2] == target2)) {
            buffer[pos++] = target2;
        }
        if ((index3 + idx_l < size_l) && (large[idx_l + index3] == target3)) {
            buffer[pos++] = target3;
        }
        if ((index4 + idx_l < size_l) && (large[idx_l + index4] == target4)) {
            buffer[pos++] = target4;
        }
        idx_s += 4;
        idx_l += index4;
    }
    if ((idx_s + 2 <= size_s) && (idx_l < size_l)) {
        uint16_t target1 = small[idx_s];
        uint16_t target2 = small[idx_s + 1];
        binarySearch2(large + idx_l, (int32_t)(size_l - idx_l), target1,
                      target2, &index1, &index2);
        if ((index1 + idx_l < size_l) && (large[idx_l + index1] == target1)) {
            buffer[pos++] = target1;
        }
        if ((index2 + idx_l < size_l) && (large[idx_l + index2] == target2)) {
            buffer[pos++] = target2;
        }
        idx_s += 2;
        idx_l += index2;
    }
    if ((idx_s < size_s) && (idx_l < size_l)) {
        uint16_t val_s = small[idx_s];
        int32_t index =
            binarySearch(large + idx_l, (int32_t)(size_l - idx_l), val_s);
        if (index >= 0) buffer[pos++] = val_s;
    }
    return (int32_t)pos;
}